

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O3

point3d * tinyusdz::geometric_normal(point3d *p0,point3d *p1,point3d *p2)

{
  undefined1 auVar1 [16];
  point3d *in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar2 = p1->x - p0->x;
  dVar5 = p1->y - p0->y;
  dVar6 = p1->z - p0->z;
  dVar4 = p2->y - p0->y;
  dVar7 = p2->z - p0->z;
  dVar8 = p2->x - p0->x;
  auVar3._0_8_ = dVar5 * dVar7 - dVar4 * dVar6;
  auVar3._8_8_ = dVar6 * dVar8 - dVar7 * dVar2;
  dVar2 = dVar2 * dVar4 - dVar8 * dVar5;
  dVar4 = dVar2 * dVar2 + auVar3._0_8_ * auVar3._0_8_ + auVar3._8_8_ * auVar3._8_8_;
  dVar4 = (double)(-(ulong)(2.220446049250313e-16 < dVar4) & (ulong)SQRT(dVar4));
  if (dVar4 <= 2.220446049250313e-16) {
    dVar4 = 2.220446049250313e-16;
  }
  auVar1._8_8_ = dVar4;
  auVar1._0_8_ = dVar4;
  auVar3 = divpd(auVar3,auVar1);
  in_RDI->x = (double)auVar3._0_8_;
  in_RDI->y = (double)auVar3._8_8_;
  in_RDI->z = dVar2 / dVar4;
  return in_RDI;
}

Assistant:

value::point3d geometric_normal(const value::point3d &p0, const value::point3d &p1, const value::point3d &p2)
{
  value::point3d n = vcross(p1 - p0, p2 - p0);

  return vnormalize(n);
}